

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

void __thiscall BN::divmod(BN *this,BN *bn,BN *div,BN *mod)

{
  ushort uVar1;
  bt *diviser;
  BN *pBVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  divide_by_zero *this_00;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  pointer puVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  bt d;
  BN dividend;
  BN divider;
  vector<unsigned_short,_std::allocator<unsigned_short>_> temp;
  bt local_ba;
  BN local_b8;
  allocator_type local_91;
  BN *local_90;
  pointer local_88;
  pointer local_80;
  undefined4 local_74;
  BN local_70;
  BN *local_58;
  pointer local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  ulong uVar18;
  
  diviser = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)diviser;
  if ((uVar6 < 3) && (*diviser == 0)) {
    this_00 = (divide_by_zero *)__cxa_allocate_exception(0x10);
    divide_by_zero::divide_by_zero(this_00);
    __cxa_throw(this_00,&divide_by_zero::typeinfo,std::logic_error::~logic_error);
  }
  if (uVar6 == 2) {
    divbase(&local_b8,this,diviser);
    if (&local_b8 != div) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=(&div->ba,&local_b8.ba)
      ;
    }
    if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    modbase(&local_b8,this,
            (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start);
    if (&local_b8 != mod) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=(&mod->ba,&local_b8.ba)
      ;
    }
  }
  else {
    bVar3 = operator<(this,bn);
    if (bVar3) {
      bn0();
      if (&local_b8 != div) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                  (&div->ba,&local_b8.ba);
      }
      if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (mod == this) {
        return;
      }
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=(&mod->ba,&this->ba);
      return;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_b8.ba,&this->ba);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_70.ba,&bn->ba);
    uVar6 = 0x10000 / (ulong)((bn->ba).
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1] + 1);
    local_ba = (bt)uVar6;
    local_74 = (undefined4)uVar6;
    local_90 = div;
    local_58 = mod;
    if (local_ba != 1) {
      mulbaseappr(&local_b8,&local_ba);
      mulbaseappr(&local_70,&local_ba);
    }
    local_80 = local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_88 = local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    lVar17 = (long)local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&local_b8.ba,lVar17 + 2);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (&local_70.ba,
               ((long)local_70.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_70.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start >> 1) + 1);
    lVar15 = (long)local_88 - (long)local_80;
    lVar12 = lVar15 >> 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (&local_90->ba,(lVar17 - lVar12) + 2);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&local_48,lVar12 + 1,&local_91);
    pBVar2 = local_58;
    uVar11 = (lVar17 - lVar12) + 1;
    local_50 = (local_90->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
    lVar13 = lVar12 + (ulong)(lVar12 == 0);
    puVar14 = local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start + ((lVar17 + 1) - lVar12);
    uVar6 = uVar11;
    do {
      lVar17 = uVar6 + lVar12;
      uVar1 = *(ushort *)
               ((long)local_70.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar15 + -2);
      uVar18 = (ulong)*(uint *)(local_b8.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar17 + -1) /
               (ulong)uVar1;
      uVar9 = *(uint *)(local_b8.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar17 + -1) % (uint)uVar1;
      iVar4 = (int)uVar18;
      if ((iVar4 == 0x10000) ||
         (((uint)local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar17 + -2] | uVar9 << 0x10) <
          (uint)*(ushort *)
                 ((long)local_70.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar15 + -4) * iVar4)) {
        uVar16 = iVar4 - 1;
        uVar18 = (ulong)uVar16;
        uVar9 = uVar9 + uVar1;
        if (uVar9 < 0x10000) {
          uVar5 = iVar4 - 2;
          if (*(ushort *)
               ((long)local_70.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar15 + -4) * uVar16 <=
              ((uint)local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar17 + -2] | uVar9 * 0x10000)) {
            uVar5 = uVar16;
          }
          uVar18 = (ulong)uVar5;
        }
      }
      iVar4 = (int)uVar18;
      if (iVar4 == 0) {
        uVar18 = 0;
      }
      else {
        if (local_88 == local_80) {
          lVar7 = 0;
        }
        else {
          lVar10 = 0;
          lVar7 = 0;
          do {
            lVar7 = ((ulong)puVar14[lVar10] + lVar7) -
                    (ulong)((uint)local_70.ba.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar10] * iVar4);
            puVar14[lVar10] = (unsigned_short)lVar7;
            lVar7 = lVar7 >> 0x10;
            lVar10 = lVar10 + 1;
          } while (lVar13 != lVar10);
        }
        uVar1 = local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar17];
        local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start[lVar17] = (unsigned_short)((ulong)uVar1 + lVar7);
        if ((long)((ulong)uVar1 + lVar7) < 0) {
          if (local_88 == local_80) {
            uVar8 = 0;
          }
          else {
            lVar7 = 0;
            uVar8 = 0;
            do {
              uVar8 = (ulong)local_70.ba.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar7] +
                      puVar14[lVar7] + uVar8;
              puVar14[lVar7] = (unsigned_short)uVar8;
              uVar8 = uVar8 >> 0x10;
              lVar7 = lVar7 + 1;
            } while (lVar13 != lVar7);
          }
          uVar18 = (ulong)(iVar4 - 1);
          local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start[lVar17] =
               local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar17] + (short)uVar8;
        }
      }
      local_50[uVar6] = (unsigned_short)uVar18;
      uVar6 = uVar6 - 1;
      puVar14 = puVar14 + -1;
    } while (uVar6 <= uVar11);
    puVar14 = (local_90->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (long)puVar14 -
            (long)(local_90->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    while ((2 < uVar6 && (puVar14 = puVar14 + -1, *puVar14 == 0))) {
      (local_90->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar14;
      uVar6 = uVar6 - 2;
    }
    uVar6 = (long)local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    while ((2 < uVar6 &&
           (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish[-1] == 0))) {
      uVar6 = uVar6 - 2;
      local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
    }
    if ((short)local_74 != 1) {
      divbaseappr(&local_b8,&local_ba);
    }
    if (&local_b8 != pBVar2) {
      puVar14 = (pBVar2->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
      (pBVar2->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
      (pBVar2->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (pBVar2->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar14 != (pointer)0x0) {
        operator_delete(puVar14);
      }
    }
    if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BN::divmod(const BN& bn, BN& div, BN& mod) const
{
    if(bn.is0())
        throw divide_by_zero();

    if(bn.ba.size() == 1) {
        div = move(this -> divbase(bn.ba.front()));
        mod = move(this -> modbase(bn.ba.front()));
        return;
    }

    if(*this < bn) {
        div = BN::bn0();
        mod = *this;
        return;
    }

    BN dividend(*this);
    BN divider(bn);

    bt d = bsize  / (bn.ba.back() + 1);
    if (d != 1) {
        dividend.mulbaseappr(d);
        divider.mulbaseappr(d);
    }

    size_t n = divider.ba.size();
    size_t m = dividend.ba.size() - n + 1;

    dividend.ba.resize(dividend.ba.size() + 2);
    divider.ba.resize(divider.ba.size() + 1);

    div.ba.resize(m + 1);

    vector<bt> temp(n + 1);
    for (size_t j = m; j <= m; --j) {
        bt2 q = (dividend.ba[j + n] * bsize + dividend.ba[j + n - 1]) / divider.ba[n-1];
        bt2 r = (dividend.ba[j + n] * bsize + dividend.ba[j + n - 1]) % divider.ba[n-1];

        if (q == bsize || q * divider.ba[n-2] > bsize * r + dividend.ba[j + n - 2]) {
            --q;
            r += divider.ba[n-1];
            if (r < bsize && q * divider.ba[n-2] > bsize * r + dividend.ba[j + n - 2])
                --q;
        }

        if (!q) {
            div.ba[j] = 0;
            continue;
        }

        bt4s x = 0;
        for (size_t i = 0; i < n; ++i) {
            x += dividend.ba[j + i];
            x -= q * divider.ba[i];
            dividend.ba[j + i] = x;
            x >>= bz8;
        }
        x += dividend.ba[j + n];
        dividend.ba[j + n] = x;

        // If `x' is negative, than `q' is too large.
        // Decrement `q' and update `dividend'.
        if (x < 0) {
            --q;
            x = 0;
            for (size_t i = 0; i < n; ++i) {
                x += dividend.ba[j + i];
                x += divider.ba[i];
                dividend.ba[j + i] = x;
                x >>= bz8;
            }
            x += dividend.ba[j + n];
            dividend.ba[j + n] = x;
        }

        div.ba[j] = q;
    }
    Norm(div.ba);
    Norm(dividend.ba);

    if (d != 1)
        dividend.divbaseappr(d);
    mod = move(dividend);
}